

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainer.h
# Opt level: O1

void __thiscall
chrono::ChContactContainer::
SumAllContactForces<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<3,3,3>>>
          (ChContactContainer *this,
          list<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
          *contactlist,
          unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
          *contactforces)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
  *puVar6;
  double dVar7;
  long lVar8;
  __node_base_ptr p_Var9;
  _Hash_node_base *p_Var10;
  unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
  *puVar11;
  __buckets_ptr pp_Var12;
  ulong uVar13;
  unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
  *puVar14;
  unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
  *puVar15;
  __node_base_ptr p_Var16;
  unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
  *puVar17;
  _List_node_base *p_Var18;
  __hash_code __code;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar42;
  double dVar43;
  double dVar44;
  undefined1 auVar45 [16];
  pair<std::__detail::_Node_iterator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false,_false>,_bool>
  pVar46;
  ChVector<double> force_loc;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  _List_node_base *local_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  ulong local_d0;
  ulong local_c8;
  double local_c0;
  _List_node_base *local_b8;
  double local_b0;
  _List_node_base *local_a8;
  double local_a0;
  _List_node_base *local_98;
  double local_90;
  _List_node_base *local_88;
  double local_80;
  _List_node_base *local_78;
  ulong local_70;
  _List_node_base *local_68;
  ulong local_60;
  double local_58;
  ulong local_50;
  ulong local_48;
  ulong uStack_40;
  
  p_Var18 = (contactlist->
            super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
            )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var18 != (_List_node_base *)contactlist) {
    local_48 = 0x8000000000000000;
    uStack_40 = 0x8000000000000000;
    puVar15 = contactforces;
    do {
      p_Var1 = p_Var18[1]._M_next;
      local_78 = *(_List_node_base **)((long)(p_Var1 + 6) + 8);
      local_90 = (double)p_Var1[7]._M_next;
      local_128._8_8_ = 0;
      local_128._0_8_ = *(_List_node_base **)((long)(p_Var1 + 7) + 8);
      local_70 = (ulong)p_Var1[8]._M_next;
      local_88 = *(_List_node_base **)((long)(p_Var1 + 8) + 8);
      local_138._8_8_ = 0;
      local_138._0_8_ = p_Var1[9]._M_next;
      local_68 = *(_List_node_base **)((long)(p_Var1 + 9) + 8);
      local_80 = (double)p_Var1[10]._M_next;
      local_148._8_8_ = 0;
      local_148._0_8_ = *(_List_node_base **)((long)(p_Var1 + 10) + 8);
      (**(code **)((long)(p_Var18[1]._M_next)->_M_next + 0x10))
                (&local_60,p_Var18[1]._M_next,puVar15);
      p_Var2 = p_Var18[1]._M_next;
      dVar27 = (double)p_Var2[2]._M_next;
      p_Var1 = *(_List_node_base **)((long)(p_Var2 + 2) + 8);
      dVar26 = (double)p_Var2[3]._M_next;
      local_98 = *(_List_node_base **)((long)(p_Var2 + 3) + 8);
      local_a0 = (double)p_Var2[4]._M_next;
      local_a8 = *(_List_node_base **)((long)(p_Var2 + 4) + 8);
      p_Var10 = (_Hash_node_base *)p_Var2[1]._M_next;
      if (p_Var10 == (_Hash_node_base *)0x0) {
        lVar8 = 0;
        uVar3 = local_60;
        dVar42 = local_58;
        uVar13 = local_50;
      }
      else {
        local_c8 = local_60;
        local_d0 = local_50;
        local_d8 = local_58;
        local_c0 = dVar26;
        local_b8 = p_Var1;
        local_b0 = dVar27;
        lVar8 = __dynamic_cast(p_Var10,&ChContactable_3vars<6,6,6>::typeinfo,&ChBody::typeinfo,
                               0xfffffffffffffffe);
        dVar27 = local_b0;
        uVar3 = local_c8;
        p_Var1 = local_b8;
        dVar26 = local_c0;
        dVar42 = local_d8;
        uVar13 = local_d0;
      }
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar13;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar3;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_78;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar42 * local_90;
      auVar20 = vfmadd213sd_fma(auVar28,auVar36,auVar20);
      auVar20 = vfmadd213sd_fma(local_128,auVar45,auVar20);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_70;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar42 * (double)local_88;
      auVar21 = vfmadd213sd_fma(auVar29,auVar36,auVar21);
      auVar21 = vfmadd213sd_fma(local_138,auVar45,auVar21);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_68;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar42 * local_80;
      auVar22 = vfmadd213sd_fma(auVar30,auVar36,auVar22);
      auVar22 = vfmadd213sd_fma(local_148,auVar45,auVar22);
      dVar43 = auVar21._0_8_;
      dVar44 = auVar22._0_8_;
      dVar42 = auVar20._0_8_;
      if (lVar8 == 0) {
        dVar19 = 0.0;
        dVar26 = 0.0;
        dVar27 = 0.0;
      }
      else {
        dVar27 = dVar27 - *(double *)(lVar8 + 0x80);
        dVar7 = (double)p_Var1 - *(double *)(lVar8 + 0x88);
        dVar26 = dVar26 - *(double *)(lVar8 + 0x90);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar43 * dVar26;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = dVar7;
        auVar28 = vfnmadd231sd_fma(auVar23,auVar33,auVar22);
        dVar19 = auVar28._0_8_;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = dVar44 * dVar27;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = dVar26;
        auVar28 = vfnmadd231sd_fma(auVar31,auVar20,auVar40);
        dVar26 = auVar28._0_8_;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = dVar42 * dVar7;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = dVar27;
        auVar28 = vfnmadd231sd_fma(auVar34,auVar21,auVar37);
        dVar27 = auVar28._0_8_;
      }
      uVar3 = (contactforces->_M_h)._M_bucket_count;
      uVar13 = (ulong)p_Var10 % uVar3;
      p_Var4 = (contactforces->_M_h)._M_buckets[uVar13];
      p_Var9 = (__node_base_ptr)0x0;
      if ((p_Var4 != (__node_base_ptr)0x0) &&
         (p_Var9 = p_Var4, p_Var16 = p_Var4->_M_nxt, p_Var10 != p_Var4->_M_nxt[1]._M_nxt)) {
        while (p_Var5 = p_Var16->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
          p_Var9 = (__node_base_ptr)0x0;
          if (((ulong)p_Var5[1]._M_nxt % uVar3 != uVar13) ||
             (p_Var9 = p_Var16, p_Var16 = p_Var5, p_Var10 == p_Var5[1]._M_nxt)) goto LAB_0057376f;
        }
        p_Var9 = (__node_base_ptr)0x0;
      }
LAB_0057376f:
      if (p_Var9 == (__node_base_ptr)0x0) {
        p_Var10 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var10 = p_Var9->_M_nxt;
      }
      if (p_Var10 == (_Hash_node_base *)0x0) {
        auVar38._0_8_ = (ulong)dVar44 ^ local_48;
        auVar38._8_8_ = auVar22._8_8_ ^ uStack_40;
        local_110 = p_Var18[1]._M_next[1]._M_next;
        auVar28 = vunpcklpd_avx(auVar20,auVar21);
        local_108 = (double)(auVar28._0_8_ ^ local_48);
        dStack_100 = (double)(auVar28._8_8_ ^ uStack_40);
        local_f8 = (double)vmovlpd_avx(auVar38);
        local_f0 = dVar19;
        local_e8 = dVar26;
        local_e0 = dVar27;
        std::
        _Hashtable<chrono::ChContactable*,std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>,std::allocator<std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>>,std::__detail::_Select1st,std::equal_to<chrono::ChContactable*>,std::hash<chrono::ChContactable*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_emplace<std::pair<chrono::ChContactable_3vars<6,6,6>*,chrono::ChContactContainer::ForceTorque>>
                  ((_Hashtable<chrono::ChContactable*,std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>,std::allocator<std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>>,std::__detail::_Select1st,std::equal_to<chrono::ChContactable*>,std::hash<chrono::ChContactable*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)contactforces,&local_110);
      }
      else {
        p_Var10[2]._M_nxt = (_Hash_node_base *)((double)p_Var10[2]._M_nxt - dVar42);
        p_Var10[3]._M_nxt = (_Hash_node_base *)((double)p_Var10[3]._M_nxt - dVar43);
        p_Var10[4]._M_nxt = (_Hash_node_base *)((double)p_Var10[4]._M_nxt - dVar44);
        p_Var10[5]._M_nxt = (_Hash_node_base *)(dVar19 + (double)p_Var10[5]._M_nxt);
        p_Var10[6]._M_nxt = (_Hash_node_base *)(dVar26 + (double)p_Var10[6]._M_nxt);
        p_Var10[7]._M_nxt = (_Hash_node_base *)(dVar27 + (double)p_Var10[7]._M_nxt);
      }
      p_Var1 = *(_List_node_base **)((long)(p_Var18[1]._M_next + 1) + 8);
      if (p_Var1 == (_List_node_base *)0x0) {
        lVar8 = 0;
      }
      else {
        lVar8 = __dynamic_cast(p_Var1,&ChContactable_3vars<3,3,3>::typeinfo,&ChBody::typeinfo,
                               0xfffffffffffffffe);
      }
      if (lVar8 == 0) {
        dVar19 = 0.0;
        dVar27 = 0.0;
        dVar26 = 0.0;
      }
      else {
        dVar19 = (double)local_98 - *(double *)(lVar8 + 0x80);
        dVar7 = local_a0 - *(double *)(lVar8 + 0x88);
        dVar27 = (double)local_a8 - *(double *)(lVar8 + 0x90);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dVar7;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = dVar43 * dVar27;
        auVar22 = vfmsub231sd_fma(auVar35,auVar24,auVar22);
        dVar26 = auVar22._0_8_;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = dVar44 * dVar19;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = dVar27;
        auVar20 = vfmsub231sd_fma(auVar32,auVar20,auVar41);
        dVar27 = auVar20._0_8_;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar42 * dVar7;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = dVar19;
        auVar20 = vfmsub231sd_fma(auVar25,auVar21,auVar39);
        dVar19 = auVar20._0_8_;
      }
      uVar3 = (contactforces->_M_h)._M_bucket_count;
      puVar14 = (unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
                 *)((ulong)p_Var1 % uVar3);
      puVar15 = (unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
                 *)(contactforces->_M_h)._M_buckets[(long)puVar14];
      puVar11 = (unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
                 *)0x0;
      if ((puVar15 !=
           (unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
            *)0x0) &&
         (puVar17 = (unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
                     *)(puVar15->_M_h)._M_buckets, puVar11 = puVar15,
         p_Var1 != (_List_node_base *)(puVar17->_M_h)._M_bucket_count)) {
        while (puVar6 = (unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
                         *)(puVar17->_M_h)._M_buckets,
              puVar6 != (unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
                         *)0x0) {
          p_Var2 = (_List_node_base *)(puVar6->_M_h)._M_bucket_count;
          puVar15 = (unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
                     *)((ulong)p_Var2 % uVar3);
          puVar11 = (unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
                     *)0x0;
          if ((puVar15 != puVar14) || (puVar11 = puVar17, puVar17 = puVar6, p_Var1 == p_Var2))
          goto LAB_00573931;
        }
        puVar11 = (unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
                   *)0x0;
      }
LAB_00573931:
      if (puVar11 ==
          (unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
           *)0x0) {
        pp_Var12 = (__buckets_ptr)0x0;
      }
      else {
        pp_Var12 = (puVar11->_M_h)._M_buckets;
      }
      if (pp_Var12 == (__buckets_ptr)0x0) {
        local_110 = *(_List_node_base **)((long)(p_Var18[1]._M_next + 1) + 8);
        local_108 = dVar42;
        dStack_100 = dVar43;
        local_f8 = dVar44;
        local_f0 = dVar26;
        local_e8 = dVar27;
        local_e0 = dVar19;
        pVar46 = std::
                 _Hashtable<chrono::ChContactable*,std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>,std::allocator<std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>>,std::__detail::_Select1st,std::equal_to<chrono::ChContactable*>,std::hash<chrono::ChContactable*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 ::
                 _M_emplace<std::pair<chrono::ChContactable_3vars<3,3,3>*,chrono::ChContactContainer::ForceTorque>>
                           ((_Hashtable<chrono::ChContactable*,std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>,std::allocator<std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>>,std::__detail::_Select1st,std::equal_to<chrono::ChContactable*>,std::hash<chrono::ChContactable*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                             *)contactforces,&local_110);
        puVar15 = pVar46._8_8_;
      }
      else {
        pp_Var12[2] = (__node_base_ptr)(dVar42 + (double)pp_Var12[2]);
        pp_Var12[3] = (__node_base_ptr)(dVar43 + (double)pp_Var12[3]);
        pp_Var12[4] = (__node_base_ptr)(dVar44 + (double)pp_Var12[4]);
        pp_Var12[5] = (__node_base_ptr)(dVar26 + (double)pp_Var12[5]);
        pp_Var12[6] = (__node_base_ptr)(dVar27 + (double)pp_Var12[6]);
        pp_Var12[7] = (__node_base_ptr)(dVar19 + (double)pp_Var12[7]);
      }
      p_Var18 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
                   *)&p_Var18->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var18 != (_List_node_base *)contactlist);
  }
  return;
}

Assistant:

void SumAllContactForces(std::list<Tcont*>& contactlist,
                             std::unordered_map<ChContactable*, ForceTorque>& contactforces) {
        for (auto contact = contactlist.begin(); contact != contactlist.end(); ++contact) {
            // Extract information for current contact (expressed in global frame)
            ChMatrix33<> A = (*contact)->GetContactPlane();
            ChVector<> force_loc = (*contact)->GetContactForce();
            ChVector<> force = A * force_loc;
            ChVector<> p1 = (*contact)->GetContactP1();
            ChVector<> p2 = (*contact)->GetContactP2();

            // Calculate contact torque for first object (expressed in global frame).
            // Recall that -force is applied to the first object.
            ChVector<> torque1(0);
            if (ChBody* body = dynamic_cast<ChBody*>((*contact)->GetObjA())) {
                torque1 = Vcross(p1 - body->GetPos(), -force);
            }

            // If there is already an entry for the first object, accumulate.
            // Otherwise, insert a new entry.
            auto entry1 = contactforces.find((*contact)->GetObjA());
            if (entry1 != contactforces.end()) {
                entry1->second.force -= force;
                entry1->second.torque += torque1;
            } else {
                ForceTorque ft{-force, torque1};
                contactforces.insert(std::make_pair((*contact)->GetObjA(), ft));
            }

            // Calculate contact torque for second object (expressed in global frame).
            // Recall that +force is applied to the second object.
            ChVector<> torque2(0);
            if (ChBody* body = dynamic_cast<ChBody*>((*contact)->GetObjB())) {
                torque2 = Vcross(p2 - body->GetPos(), force);
            }

            // If there is already an entry for the first object, accumulate.
            // Otherwise, insert a new entry.
            auto entry2 = contactforces.find((*contact)->GetObjB());
            if (entry2 != contactforces.end()) {
                entry2->second.force += force;
                entry2->second.torque += torque2;
            } else {
                ForceTorque ft{force, torque2};
                contactforces.insert(std::make_pair((*contact)->GetObjB(), ft));
            }
        }
    }